

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderApiTests.cpp
# Opt level: O0

void deqp::gles3::Functional::anon_unknown_0::logProgram
               (TestLog *log,RenderContext *renderCtx,Program *program,ShaderAllocator *shaders)

{
  Program *renderCtx_00;
  RenderContext *log_00;
  bool bVar1;
  string *linkInfoLog;
  Shader *shader;
  ShaderType local_60;
  ShaderType shaderType;
  int shaderTypeInt;
  LogShaderProgram local_50;
  ShaderAllocator *local_28;
  ShaderAllocator *shaders_local;
  Program *program_local;
  RenderContext *renderCtx_local;
  TestLog *log_local;
  
  local_28 = shaders;
  shaders_local = (ShaderAllocator *)program;
  program_local = (Program *)renderCtx;
  renderCtx_local = (RenderContext *)log;
  bVar1 = glu::Program::getLinkStatus(program);
  linkInfoLog = glu::Program::getInfoLog_abi_cxx11_((Program *)shaders_local);
  tcu::LogShaderProgram::LogShaderProgram(&local_50,bVar1,linkInfoLog);
  tcu::TestLog::operator<<(log,&local_50);
  tcu::LogShaderProgram::~LogShaderProgram(&local_50);
  for (local_60 = SHADERTYPE_VERTEX; (int)local_60 < 6; local_60 = local_60 + SHADERTYPE_FRAGMENT) {
    bVar1 = ShaderAllocator::hasShader(local_28,local_60);
    log_00 = renderCtx_local;
    renderCtx_00 = program_local;
    if (bVar1) {
      shader = ShaderAllocator::get(local_28,local_60);
      logShader((TestLog *)log_00,(RenderContext *)renderCtx_00,shader);
    }
  }
  tcu::TestLog::operator<<
            ((TestLog *)renderCtx_local,(EndShaderProgramToken *)&tcu::TestLog::EndShaderProgram);
  return;
}

Assistant:

void logProgram (TestLog& log, glu::RenderContext& renderCtx, glu::Program& program, ShaderAllocator& shaders)
{
	log << TestLog::ShaderProgram(program.getLinkStatus(), program.getInfoLog());

	for (int shaderTypeInt = 0; shaderTypeInt < glu::SHADERTYPE_LAST; shaderTypeInt++)
	{
		const glu::ShaderType shaderType = (glu::ShaderType)shaderTypeInt;

		if (shaders.hasShader(shaderType))
			logShader(log, renderCtx, shaders.get(shaderType));
	}

	log << TestLog::EndShaderProgram;
}